

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O2

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::upToLast
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *find,bool includeFind)

{
  uint uVar1;
  int in_ECX;
  uint _length;
  undefined7 in_register_00000011;
  undefined8 extraout_RDX;
  char *_data;
  bool bVar2;
  VerySimpleReadOnlyString VVar3;
  
  uVar1 = reverseFind(find,(VerySimpleReadOnlyString *)CONCAT71(in_register_00000011,includeFind),
                      0xffffffff);
  _data = "";
  if (in_ECX == 0) {
    _data = find->data;
  }
  bVar2 = uVar1 != find->length;
  if (bVar2) {
    _data = find->data;
  }
  _length = 0;
  if (bVar2) {
    _length = ((VerySimpleReadOnlyString *)CONCAT71(in_register_00000011,includeFind))->length +
              uVar1;
  }
  if (in_ECX == 0) {
    _length = uVar1;
  }
  VerySimpleReadOnlyString(this,_data,_length);
  VVar3._8_8_ = extraout_RDX;
  VVar3.data = (tCharPtr)this;
  return VVar3;
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::upToLast(const VerySimpleReadOnlyString & find, const bool includeFind) const
	{
	    const unsigned int pos = reverseFind(find);
	    return VerySimpleReadOnlyString(pos == (unsigned int)length && includeFind ? "" : data, includeFind ? (pos == (unsigned int)length ? 0 : pos + (unsigned int)find.length) : pos);
	}